

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,char32_t value)

{
  ostream *poVar1;
  void *this_00;
  Debug *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  char local_1a1;
  int local_1a0;
  ostringstream local_190 [8];
  ostringstream o;
  char32_t value_local;
  Debug *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"U+");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::hex);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,std::uppercase);
  local_1a0 = (int)std::setw(4);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1a0);
  local_1a1 = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(poVar1,local_1a1);
  std::ostream::operator<<(poVar1,value);
  std::__cxx11::ostringstream::str();
  pDVar2 = print<std::__cxx11::string>(this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return pDVar2;
}

Assistant:

Debug& Debug::operator<<(char32_t value) {
    std::ostringstream o;
    o << "U+" << std::hex << std::uppercase << std::setw(4) << std::setfill('0') << std::uint32_t(value);
    return print(o.str());
}